

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_c_function_data_call
                  (JSContext *ctx,JSValue func_obj,JSValue this_val,int argc,JSValue *argv,int flags
                  )

{
  byte bVar1;
  undefined2 uVar2;
  code *pcVar3;
  long lVar4;
  int64_t *piVar5;
  JSValue *__dest;
  JSValue *pJVar6;
  undefined8 *puVar7;
  JSValue JVar8;
  undefined8 uStack_50;
  JSValue JStack_48;
  JSValue *local_38;
  
  JStack_48.tag = (int64_t)func_obj.u;
  __dest = &JStack_48;
  if (((int)func_obj.tag == -1) && (*(short *)(JStack_48.tag + 6) == 0xf)) {
    puVar7 = *(undefined8 **)(JStack_48.tag + 0x30);
  }
  else {
    puVar7 = (undefined8 *)0x0;
  }
  bVar1 = *(byte *)(puVar7 + 1);
  pJVar6 = argv;
  if (argc < (int)(uint)bVar1) {
    __dest = &JStack_48 + -(ulong)bVar1;
    pJVar6 = __dest;
    if (0 < argc) {
      local_38 = __dest;
      (&uStack_50)[(ulong)bVar1 * -2] = 0x117fdc;
      memcpy(__dest,argv,(ulong)(uint)argc << 4);
      pJVar6 = local_38;
    }
    if (argc < (int)(uint)*(byte *)(puVar7 + 1)) {
      lVar4 = (long)argc;
      piVar5 = &pJVar6[lVar4].tag;
      do {
        (((JSValue *)(piVar5 + -1))->u).int32 = 0;
        *piVar5 = 3;
        lVar4 = lVar4 + 1;
        piVar5 = piVar5 + 2;
      } while (lVar4 < (long)(ulong)*(byte *)(puVar7 + 1));
    }
  }
  uVar2 = *(undefined2 *)((long)puVar7 + 10);
  __dest[-1].u.ptr = puVar7 + 2;
  pcVar3 = (code *)*puVar7;
  __dest[-2].tag = 0x117fa7;
  JVar8 = (JSValue)(*pcVar3)(ctx,this_val.u.float64,this_val.tag,(ulong)(uint)argc,pJVar6,uVar2);
  return JVar8;
}

Assistant:

static JSValue js_c_function_data_call(JSContext *ctx, JSValueConst func_obj,
                                       JSValueConst this_val,
                                       int argc, JSValueConst *argv, int flags)
{
    JSCFunctionDataRecord *s = JS_GetOpaque(func_obj, JS_CLASS_C_FUNCTION_DATA);
    JSValueConst *arg_buf;
    int i;

    /* XXX: could add the function on the stack for debug */
    if (unlikely(argc < s->length)) {
        arg_buf = alloca(sizeof(arg_buf[0]) * s->length);
        for(i = 0; i < argc; i++)
            arg_buf[i] = argv[i];
        for(i = argc; i < s->length; i++)
            arg_buf[i] = JS_UNDEFINED;
    } else {
        arg_buf = argv;
    }

    return s->func(ctx, this_val, argc, arg_buf, s->magic, s->data);
}